

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::SparseDSATextureCommitmentTestCase::iterate(SparseDSATextureCommitmentTestCase *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ContextInfo *pCVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  byte local_25a;
  byte local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  MessageBuilder local_220;
  uint local_a0;
  int l;
  allocator<char> local_89;
  string local_88 [32];
  uint *local_68;
  GLint *format;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  GLuint texture;
  bool result;
  Functions *gl;
  SparseDSATextureCommitmentTestCase *this_local;
  Functions *gl_00;
  
  pCVar4 = deqp::Context::getContextInfo
                     ((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_ARB_sparse_texture");
  if (bVar1) {
    pCVar4 = deqp::Context::getContextInfo
                       ((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_direct_state_access");
    if (bVar1) {
      pRVar5 = deqp::Context::getRenderContext
                         ((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context);
      iVar2 = (*pRVar5->_vptr_RenderContext[3])();
      gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
      iter._M_current._7_1_ = 1;
      local_38._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            (&(this->super_SparseTextureCommitmentTestCase).mSupportedTargets);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
                 &local_38);
      while( true ) {
        target = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                    (&(this->super_SparseTextureCommitmentTestCase).
                                      mSupportedTargets);
        bVar1 = __gnu_cxx::operator!=
                          (&local_30,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &target);
        if (!bVar1) break;
        formIter._M_current =
             __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_30);
        local_58._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (&(this->super_SparseTextureCommitmentTestCase).
                                mSupportedInternalFormats);
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
                   &local_58);
        while( true ) {
          format = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                      (&(this->super_SparseTextureCommitmentTestCase).
                                        mSupportedInternalFormats);
          bVar1 = __gnu_cxx::operator!=
                            (&local_50,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &format);
          if (!bVar1) break;
          local_68 = (uint *)__gnu_cxx::
                             __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ::operator*(&local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
          std::__cxx11::stringstream::str
                    ((string *)&(this->super_SparseTextureCommitmentTestCase).mLog);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator(&local_89);
          poVar6 = std::operator<<((ostream *)
                                   &(this->super_SparseTextureCommitmentTestCase).field_0x88,
                                   "Testing DSA sparse texture commitment for target: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*formIter._M_current);
          poVar6 = std::operator<<(poVar6,", format: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_68);
          std::operator<<(poVar6," - ");
          (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[8])
                    (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,3);
          for (local_a0 = 0;
              (int)local_a0 < (this->super_SparseTextureCommitmentTestCase).mState.levels;
              local_a0 = local_a0 + 1) {
            uVar3 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0xc])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                               (ulong)local_a0);
            if ((uVar3 & 1) != 0) {
              (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                super_TestNode._vptr_TestNode[10])
                        (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                         (ulong)local_a0);
              iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode[0xb])
                                (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter
                                 ,(ulong)local_a0);
              iter._M_current._7_1_ = (byte)iVar2 & 1;
            }
            if ((iter._M_current._7_1_ & 1) == 0) break;
          }
          gl4cts::Texture::Delete(gl_00,(GLuint *)&iter);
          local_259 = 0;
          if ((iter._M_current._7_1_ & 1) != 0) {
            iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0xf])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter);
            local_259 = (byte)iVar2;
          }
          iter._M_current._7_1_ = local_259 & 1;
          local_25a = 0;
          if (iter._M_current._7_1_ != 0) {
            iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x10])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter);
            local_25a = (byte)iVar2;
          }
          iter._M_current._7_1_ = local_25a & 1;
          if (iter._M_current._7_1_ == 0) {
            this_00 = tcu::TestContext::getLog
                                ((this->super_SparseTextureCommitmentTestCase).super_TestCase.
                                 super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_220,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            std::__cxx11::stringstream::str();
            pMVar7 = tcu::MessageBuilder::operator<<(&local_220,&local_240);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])0x2c1a0be);
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_240);
            tcu::MessageBuilder::~MessageBuilder(&local_220);
            tcu::TestContext::setTestResult
                      ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
            return STOP;
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_50);
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_30);
      }
      tcu::TestContext::setTestResult
                ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_NOT_SUPPORTED,
                 "GL_EXT_direct_state_access extension is not supported.");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseDSATextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_direct_state_access"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_EXT_direct_state_access extension is not supported.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing DSA sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into committed region is as expected
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}